

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestStartCommand::InitialCheckout(cmCTestStartCommand *this,ostream *ofs,string *sourceDir)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char *command;
  cmCTestVC vc;
  undefined1 local_1b0 [392];
  
  pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  pcVar1 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"CTEST_CHECKOUT_COMMAND","");
  command = cmMakefile::GetDefinition(pcVar2,(string *)local_1b0);
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (command == (char *)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"CTEST_CVS_CHECKOUT","");
    command = cmMakefile::GetDefinition(pcVar2,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (command == (char *)0x0) {
      return true;
    }
  }
  cmCTestVC::cmCTestVC((cmCTestVC *)local_1b0,(this->super_cmCTestCommand).CTest,ofs);
  cmCTestVC::SetSourceDirectory((cmCTestVC *)local_1b0,sourceDir);
  bVar3 = cmCTestVC::InitialCheckout((cmCTestVC *)local_1b0,command);
  cmCTestVC::~cmCTestVC((cmCTestVC *)local_1b0);
  if (bVar3) {
    return true;
  }
  return false;
}

Assistant:

bool cmCTestStartCommand::InitialCheckout(
  std::ostream& ofs, std::string const& sourceDir)
{
  // Use the user-provided command to create the source tree.
  const char* initialCheckoutCommand
    = this->Makefile->GetDefinition("CTEST_CHECKOUT_COMMAND");
  if(!initialCheckoutCommand)
    {
    initialCheckoutCommand =
      this->Makefile->GetDefinition("CTEST_CVS_CHECKOUT");
    }
  if(initialCheckoutCommand)
    {
    // Use a generic VC object to run and log the command.
    cmCTestVC vc(this->CTest, ofs);
    vc.SetSourceDirectory(sourceDir);
    if(!vc.InitialCheckout(initialCheckoutCommand))
      {
      return false;
      }
    }
  return true;
}